

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

void ob_q_free(nghttp2_outbound_queue *q,nghttp2_mem *mem)

{
  nghttp2_outbound_item *pnVar1;
  nghttp2_outbound_item *item;
  
  if (q != (nghttp2_outbound_queue *)0x0) {
    do {
      pnVar1 = ((nghttp2_outbound_item *)q)->qnext;
      nghttp2_outbound_item_free((nghttp2_outbound_item *)q,mem);
      nghttp2_mem_free(mem,q);
      q = (nghttp2_outbound_queue *)pnVar1;
    } while (pnVar1 != (nghttp2_outbound_item *)0x0);
  }
  return;
}

Assistant:

static void ob_q_free(nghttp2_outbound_queue *q, nghttp2_mem *mem) {
  nghttp2_outbound_item *item, *next;
  for (item = q->head; item;) {
    next = item->qnext;
    nghttp2_outbound_item_free(item, mem);
    nghttp2_mem_free(mem, item);
    item = next;
  }
}